

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Uint wabt::anon_unknown_0::FloatParser<float>::Make(bool sign,int exp,Uint sig)

{
  if (0xff < exp + 0x7fU) {
    __assert_fail("exp >= Traits::kMinExp && exp <= Traits::kMaxExp",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/literal.cc"
                  ,0xb3,
                  "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::Make(bool, int, Uint) [T = float]"
                 );
  }
  if (sig < 0x800000) {
    return exp * 0x800000 + 0x3f800000U | (uint)sign << 0x1f | sig;
  }
  __assert_fail("sig <= Traits::kSigMask",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/literal.cc"
                ,0xb4,
                "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::Make(bool, int, Uint) [T = float]"
               );
}

Assistant:

typename FloatParser<T>::Uint FloatParser<T>::Make(bool sign,
                                                   int exp,
                                                   Uint sig) {
  assert(exp >= Traits::kMinExp && exp <= Traits::kMaxExp);
  assert(sig <= Traits::kSigMask);
  return (Uint(sign) << Traits::kSignShift) |
         (Uint(exp + Traits::kExpBias) << Traits::kSigBits) | sig;
}